

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_CPY_m_i(DisasContext_conflict1 *s,arg_rpri_esz *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  TCGv_i64 val;
  TCGv_i64 t_imm;
  TCGContext_conflict1 *tcg_ctx;
  arg_rpri_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((a->esz == 0) && (uVar2 = extract32(s->insn,0xd,1), uVar2 != 0)) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      val = tcg_const_i64_aarch64(tcg_ctx_00,(long)a->imm);
      do_cpy_m(s,a->esz,a->rd,a->rn,a->pg,val);
      tcg_temp_free_i64(tcg_ctx_00,val);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_CPY_m_i(DisasContext *s, arg_rpri_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0 && extract32(s->insn, 13, 1)) {
        return false;
    }
    if (sve_access_check(s)) {
        TCGv_i64 t_imm = tcg_const_i64(tcg_ctx, a->imm);
        do_cpy_m(s, a->esz, a->rd, a->rn, a->pg, t_imm);
        tcg_temp_free_i64(tcg_ctx, t_imm);
    }
    return true;
}